

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Date.cpp
# Opt level: O0

int asl::yearFromTime(double t)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  undefined4 local_44;
  undefined4 local_40;
  int j3;
  int k3;
  int j2;
  int k2;
  int year;
  int j1;
  int k1;
  int j3_1;
  int k3_1;
  int year_1;
  int d;
  double t_local;
  
  dVar4 = floor(t * 1.1574074074074073e-05);
  iVar1 = (int)dVar4 + 0xafaa8;
  if ((iVar1 < 0xa9c7e) || (0xbb2b4 < iVar1)) {
    iVar2 = iVar1 % 0x23ab1;
    k3 = 0;
    j3 = 0;
    if (0x8ead < iVar2) {
      iVar3 = (iVar2 + -0x8ead) / 0x8eac;
      k3 = iVar3 + 1;
      j3 = iVar3 * 0x8eac + 0x8ead;
    }
    iVar2 = iVar2 - j3;
    local_40 = 0;
    local_44 = 0;
    if (k3 == 0) {
      local_40 = iVar2 / 0x5b5;
      local_44 = local_40 * 0x5b5;
    }
    else if (0x5b4 < iVar2) {
      iVar3 = (iVar2 + -0x5b4) / 0x5b5;
      local_40 = iVar3 + 1;
      local_44 = iVar3 * 0x5b5 + 0x5b4;
    }
    iVar2 = iVar2 - local_44;
    j2 = local_40 * 4 + k3 * 100 + (iVar1 / 0x23ab1) * 400;
    if ((local_40 == 0) && (k3 != 0)) {
      j2 = iVar2 / 0x16d + j2;
    }
    else if (iVar2 < 0x2db) {
      if (0x16d < iVar2) {
        j2 = j2 + 1;
      }
    }
    else {
      iVar1 = 3;
      if (iVar2 < 0x448) {
        iVar1 = 2;
      }
      j2 = iVar1 + j2;
    }
    t_local._4_4_ = j2;
  }
  else {
    iVar2 = (int)dVar4 + 0x5e2b;
    iVar1 = (iVar2 / 0x5b5) * 4;
    j3_1 = iVar1 + 0x770;
    iVar2 = iVar2 % 0x5b5;
    if (iVar2 < 0x2db) {
      if (0x16d < iVar2) {
        j3_1 = iVar1 + 0x771;
      }
    }
    else {
      iVar1 = 3;
      if (iVar2 < 0x448) {
        iVar1 = 2;
      }
      j3_1 = iVar1 + j3_1;
    }
    t_local._4_4_ = j3_1;
  }
  return t_local._4_4_;
}

Assistant:

static int yearFromTime(double t)
{
	static const int d4y = 365 * 4 + 1;     // 4 year block with 1 leap
	static const int d100y = d4y * 25 - 1;  // 100 year block (except multiples of 400)
	static const int d400y = 4 * d100y + 1; // 400 year block (one more leap for the first year in the block)

	int d = (int)floor(t * (1 / 86400.0)) + d400y * 4 + d100y + 1 + d100y * 2 + d4y - 1 + 16 * d4y + 2 * 365 + 1;
	//(1970 = 4 * 400 + 3 * 100 + 17 * 4 + 2)
	if (d > 695421 && d < 766645) // 1904 - 2099 : all d4y blocks
	{
		d -= 695421;
		int year = 1904;
		int k3 = (d / d4y); // num blocks 4y
		int j3 = k3 * d4y;  // start of current 4y block
		year += k3 * 4;
		d -= j3;
		if (d >= 366 + 365)
			year += (d < 366 + 2 * 365) ? 2 : 3;
		else if (d >= 366)
			year += 1;
		return year;
	}

	int k1 = (d / d400y); // num blocks 400y
	int j1 = k1 * d400y;  // start of current 400y block
	int year = k1 * 400;
	d = d - j1; // time relative to current 400y block
	int k2 = 0, j2 = 0;
	if (d > d100y + 1)
	{
		k2 = 1 + ((d - d100y - 1) / d100y); // num blocks 100y
		j2 = d100y + 1 + (k2 - 1) * d100y;
	}
	year += k2 * 100;
	d = d - j2;
	int k3 = 0, j3 = 0;
	if (k2 == 0) // first 100y block -> all d4y
	{
		k3 = (d / d4y); // num blocks 4y
		j3 = k3 * d4y;  // start of current 4y block
	}
	else if (d > d4y - 1)
	{
		k3 = 1 + ((d - d4y + 1) / d4y);
		j3 = d4y - 1 + (k3 - 1) * d4y;
	}
	d = d - j3; // time relative to current 4y block
	year += k3 * 4;
	if (k3 == 0 && k2 != 0) // all 365d
		year += (d / 365);
	else if (d >= 366 + 365)
		year += (d < 366 + 2 * 365) ? 2 : 3;
	else if (d >= 366)
		year += 1;
	return year;
}